

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

void __thiscall PageStack<FinalizableObject_*>::Release(PageStack<FinalizableObject_*> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Chunk *chunk;
  
  bVar2 = IsEmpty(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x187,"(IsEmpty())","IsEmpty()");
    if (!bVar2) goto LAB_006663f4;
    *puVar3 = 0;
  }
  chunk = this->currentChunk;
  if (chunk != (Chunk *)0x0) {
    if (chunk->nextChunk != (Chunk *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x18c,"(currentChunk->nextChunk == nullptr)",
                         "currentChunk->nextChunk == nullptr");
      if (!bVar2) {
LAB_006663f4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      chunk = this->currentChunk;
    }
    FreeChunk(this,chunk);
    this->currentChunk = (Chunk *)0x0;
  }
  this->nextEntry = (FinalizableObject **)0x0;
  this->chunkStart = (FinalizableObject **)0x0;
  this->chunkEnd = (FinalizableObject **)0x0;
  return;
}

Assistant:

void PageStack<T>::Release()
{
    Assert(IsEmpty());

    // We may have a preallocated chunk still held; if so release it.
    if (currentChunk != nullptr)
    {
        Assert(currentChunk->nextChunk == nullptr);
        FreeChunk(currentChunk);
        currentChunk = nullptr;
    }

    nextEntry = nullptr;
    chunkStart = nullptr;
    chunkEnd = nullptr;
}